

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_position.c
# Opt level: O1

void test_read_position(void)

{
  long s;
  int iVar1;
  wchar_t wVar2;
  archive *paVar3;
  archive_entry *entry;
  la_ssize_t lVar4;
  long lVar5;
  size_t write_pos;
  size_t local_38;
  
  lVar5 = 0;
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'K',L'\x01',"sizeof(nulls) + 512 + 1024 <= sizeof(buff)",(void *)0x0);
  paVar3 = archive_write_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'N',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_write_new())",
                   (void *)0x0);
  iVar1 = archive_write_set_format_pax_restricted(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'O',(uint)(iVar1 == 0),"0 == archive_write_set_format_pax_restricted(a)",paVar3
                  );
  iVar1 = archive_write_set_bytes_per_block(paVar3,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'P',(uint)(iVar1 == 0),"0 == archive_write_set_bytes_per_block(a, 512)",paVar3)
  ;
  iVar1 = archive_write_open_memory(paVar3,buff,10000,&local_38);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'Q',(uint)(iVar1 == 0),
                   "0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos)",paVar3);
  do {
    entry = archive_entry_new();
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'U',(uint)(entry != (archive_entry *)0x0),
                     "(ae = archive_entry_new()) != NULL",(void *)0x0);
    archive_entry_set_pathname(entry,"testfile");
    archive_entry_set_mode(entry,0x8000);
    s = *(long *)((long)data_sizes + lVar5);
    archive_entry_set_size(entry,s);
    iVar1 = archive_write_header(paVar3,entry);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'Y',(uint)(iVar1 == 0),"0 == archive_write_header(a, ae)",paVar3);
    archive_entry_free(entry);
    lVar4 = archive_write_data(paVar3,nulls,1000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                     ,L'\\',(uint)(s == lVar4),
                     "data_sizes[i] == (size_t)archive_write_data(a, nulls, sizeof(nulls))",paVar3);
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x28);
  iVar1 = archive_write_close(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'^',0,"ARCHIVE_OK",(long)iVar1,"archive_write_close(a)",paVar3);
  iVar1 = archive_write_free(paVar3);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                      ,L'_',0,"ARCHIVE_OK",(long)iVar1,"archive_write_free(a)",(void *)0x0);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'b',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar2 = archive_read_support_format_tar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'c',(uint)(wVar2 == L'\0'),"0 == archive_read_support_format_tar(a)",paVar3);
  iVar1 = read_open_memory(paVar3,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'd',(uint)(iVar1 == 0),"0 == read_open_memory(a, buff, sizeof(buff), 512)",
                   paVar3);
  verify_read_positions(paVar3);
  archive_read_free(paVar3);
  paVar3 = archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'i',(uint)(paVar3 != (archive *)0x0),"NULL != (a = archive_read_new())",
                   (void *)0x0);
  wVar2 = archive_read_support_format_tar(paVar3);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'j',(uint)(wVar2 == L'\0'),"0 == archive_read_support_format_tar(a)",paVar3);
  iVar1 = read_open_memory_minimal(paVar3,buff,10000,0x200);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_position.c"
                   ,L'k',(uint)(iVar1 == 0),
                   "0 == read_open_memory_minimal(a, buff, sizeof(buff), 512)",paVar3);
  verify_read_positions(paVar3);
  archive_read_free(paVar3);
  return;
}

Assistant:

DEFINE_TEST(test_read_position)
{
	struct archive *a;
	struct archive_entry *ae;
	size_t write_pos;
	size_t i;

	/* Sanity test */
	assert(sizeof(nulls) + 512 + 1024 <= sizeof(buff));

	/* Create an archive. */
	assert(NULL != (a = archive_write_new()));
	assertA(0 == archive_write_set_format_pax_restricted(a));
	assertA(0 == archive_write_set_bytes_per_block(a, 512));
	assertA(0 == archive_write_open_memory(a, buff, sizeof(buff), &write_pos));

	for (i = 0; i < sizeof(data_sizes)/sizeof(data_sizes[0]); ++i) {
		/* Create a simple archive_entry. */
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_set_pathname(ae, "testfile");
		archive_entry_set_mode(ae, S_IFREG);
		archive_entry_set_size(ae, data_sizes[i]);
		assertA(0 == archive_write_header(a, ae));
		archive_entry_free(ae);
		assertA(data_sizes[i]
		    == (size_t)archive_write_data(a, nulls, sizeof(nulls)));
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/* Read the archive back with a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

	/* Read the archive back without a skip function. */
	assert(NULL != (a = archive_read_new()));
	assertA(0 == archive_read_support_format_tar(a));
	assertA(0 == read_open_memory_minimal(a, buff, sizeof(buff), 512));
	verify_read_positions(a);
	archive_read_free(a);

}